

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O0

QSize __thiscall QCollapsibleFrame::minimumSizeHint(QCollapsibleFrame *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  QWidget *pQVar6;
  long *plVar7;
  long in_RDI;
  int spacing;
  QMargins margins;
  QSize sh;
  QSize local_44;
  QSize local_3c;
  int local_34;
  int local_30;
  undefined4 local_2c;
  undefined4 local_28;
  int local_24;
  QMargins local_20;
  QSize local_8;
  
  local_20 = (QMargins)QLayout::contentsMargins();
  local_8 = (QSize)(**(code **)(**(long **)(*(long *)(in_RDI + 0x28) + 0x28) + 0x78))();
  iVar1 = QMargins::left(&local_20);
  iVar2 = QMargins::right(&local_20);
  piVar5 = QSize::rwidth(&local_8);
  *piVar5 = iVar1 + iVar2 + *piVar5;
  iVar1 = QMargins::top(&local_20);
  iVar2 = QMargins::bottom(&local_20);
  piVar5 = QSize::rheight(&local_8);
  *piVar5 = iVar1 + iVar2 + *piVar5;
  if ((*(byte *)(*(long *)(in_RDI + 0x28) + 0x60) & 1) == 0) {
    pQVar6 = QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x1f1f06);
    if (pQVar6 != (QWidget *)0x0) {
      local_24 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x28) + 0x20) + 0x60))();
      if (local_24 == -1) {
        plVar7 = (long *)QWidget::style();
        local_24 = (**(code **)(*plVar7 + 0xe0))(plVar7,0x50,0);
      }
      if (local_24 == -1) {
        plVar7 = (long *)QWidget::style();
        local_28 = QWidget::sizePolicy();
        uVar3 = QSizePolicy::controlType();
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x1f1fa7);
        local_2c = QWidget::sizePolicy();
        uVar4 = QSizePolicy::controlType();
        local_24 = (**(code **)(*plVar7 + 0x110))(plVar7,uVar3,uVar4,2,0,in_RDI);
      }
      local_30 = QSize::width(&local_8);
      pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x1f2007);
      local_3c = (QSize)(**(code **)(*(long *)pQVar6 + 0x78))();
      local_34 = QSize::width(&local_3c);
      piVar5 = qMax<int>(&local_30,&local_34);
      iVar1 = *piVar5;
      piVar5 = QSize::rwidth(&local_8);
      *piVar5 = iVar1;
      pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x1f2060);
      local_44 = (QSize)(**(code **)(*(long *)pQVar6 + 0x78))();
      iVar2 = QSize::height(&local_44);
      piVar5 = QSize::rheight(&local_8);
      iVar1 = local_24;
      *piVar5 = iVar2 + *piVar5;
      piVar5 = QSize::rheight(&local_8);
      *piVar5 = iVar1 + *piVar5;
    }
  }
  return local_8;
}

Assistant:

QSize QCollapsibleFrame::minimumSizeHint() const {
    const QMargins margins = d->verticalLayout->contentsMargins();
    QSize sh(d->button->minimumSizeHint());

    sh.rwidth() += margins.left() + margins.right();
    sh.rheight() += margins.top() + margins.bottom();

    if (d->collapsed) {
    } else if (d->widget) {
        int spacing = d->verticalLayout->spacing();

        if (spacing == -1) {
            spacing = style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing);
        }

        if (spacing == -1) {
            spacing = style()->layoutSpacing(d->button->sizePolicy().controlType(),
                                             d->widget->sizePolicy().controlType(), Qt::Vertical, nullptr, this);
        }

        sh.rwidth() = qMax(sh.width(), d->widget->minimumSizeHint().width());
        sh.rheight() += d->widget->minimumSizeHint().height();
        sh.rheight() += spacing;
    }

    return sh;
}